

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  DeathTestOutcome DVar1;
  uint uVar2;
  bool bVar3;
  Message *pMVar4;
  Message *pMVar5;
  uint uVar6;
  bool bVar7;
  Message buffer;
  Message m;
  String local_40;
  uint local_2c;
  String error_message;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStderr();
  Message::Message(&buffer);
  pMVar4 = Message::operator<<(&buffer,(char (*) [13])"Death test: ");
  local_40.c_str_ = this->statement_;
  pMVar4 = Message::operator<<(pMVar4,&local_40.c_str_);
  Message::operator<<(pMVar4,(char (*) [2])0x179141);
  DVar1 = this->outcome_;
  if (DVar1 == DIED) {
    if (status_ok) {
      bVar3 = RE::PartialMatch(error_message.c_str_,this->regex_);
      bVar7 = true;
      if (bVar3) goto LAB_0015afc5;
      pMVar4 = Message::operator<<(&buffer,(char (*) [47])
                                           "    Result: died but not with expected error.\n");
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"  Expected: ");
      local_40.c_str_ = *(char **)this->regex_;
      pMVar4 = Message::operator<<(pMVar4,&local_40.c_str_);
      pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x179141);
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"Actual msg: ");
      Message::operator<<(pMVar4,&error_message);
    }
    else {
      pMVar4 = Message::operator<<(&buffer,(char (*) [51])
                                           "    Result: died but not with expected exit code:\n");
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"            ");
      uVar2 = this->status_;
      Message::Message(&m);
      uVar6 = uVar2 & 0x7f;
      if (uVar6 == 0) {
        pMVar5 = Message::operator<<(&m,(char (*) [25])"Exited with exit status ");
        local_2c = uVar2 >> 8 & 0xff;
        Message::operator<<(pMVar5,(int *)&local_2c);
      }
      else if (0x1ffffff < (int)(uVar6 * 0x1000000 + 0x1000000)) {
        pMVar5 = Message::operator<<(&m,(char (*) [22])"Terminated by signal ");
        local_2c = uVar6;
        Message::operator<<(pMVar5,(int *)&local_2c);
      }
      if ((char)uVar2 < '\0') {
        Message::operator<<(&m,(char (*) [15])" (core dumped)");
      }
      StrStreamToString((internal *)&local_40,m.ss_);
      if (m.ss_ != (StrStream *)0x0) {
        (**(code **)(*(long *)m.ss_ + 8))();
      }
      pMVar4 = Message::operator<<(pMVar4,&local_40);
      Message::operator<<(pMVar4,(char (*) [2])0x179141);
      String::~String(&local_40);
    }
  }
  else {
    if (DVar1 == LIVED) {
      pMVar4 = Message::operator<<(&buffer,(char (*) [28])"    Result: failed to die.\n");
    }
    else {
      if (DVar1 != RETURNED) {
        GTestLog::GTestLog((GTestLog *)&local_40,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                           ,0x197a);
        std::operator<<((ostream *)&std::cerr,
                        "DeathTest::Passed somehow called before conclusion of test");
        GTestLog::~GTestLog((GTestLog *)&local_40);
        goto LAB_0015afc3;
      }
      pMVar4 = Message::operator<<(&buffer,(char (*) [47])
                                           "    Result: illegal return in test statement.\n");
    }
    pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg: ");
    Message::operator<<(pMVar4,&error_message);
  }
LAB_0015afc3:
  bVar7 = false;
LAB_0015afc5:
  StrStreamToString((internal *)&local_40,buffer.ss_);
  DeathTest::set_last_death_test_message(&local_40);
  String::~String(&local_40);
  if (buffer.ss_ != (StrStream *)0x0) {
    (**(code **)(*(long *)buffer.ss_ + 8))();
  }
  String::~String(&error_message);
  return bVar7;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const String error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg: " << error_message;
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg: " << error_message;
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg: " << error_message;
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n";
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}